

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

namespace_t * __thiscall cs_impl::any::holder<bool>::get_ext(holder<bool> *this)

{
  namespace_t *pnVar1;
  
  pnVar1 = get_ext<bool>();
  return pnVar1;
}

Assistant:

virtual cs::namespace_t &get_ext() const override
			{
				return cs_impl::get_ext<T>();
			}